

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPublicKey.cpp
# Opt level: O2

ByteString * __thiscall
RSAPublicKey::serialise(ByteString *__return_storage_ptr__,RSAPublicKey *this)

{
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_38,&this->n);
  ByteString::serialise(&local_60,&this->e);
  operator+(__return_storage_ptr__,&local_38,&local_60);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteString RSAPublicKey::serialise() const
{
	return n.serialise() +
	       e.serialise();
}